

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

UString * jsonnet::internal::jsonnet_string_unescape
                    (UString *__return_storage_ptr__,LocationRange *loc,UString *s)

{
  char32_t cVar1;
  unsigned_long high;
  unsigned_long low;
  StaticError *pSVar2;
  ostream *poVar3;
  char32_t *pcVar4;
  char32_t *pcVar5;
  string utf8;
  stringstream ss;
  string local_200;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *local_1e0;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  local_1e0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1e0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pcVar5 = (s->_M_dataplus)._M_p;
  do {
    cVar1 = *pcVar5;
    if (cVar1 == L'\\') {
      pcVar4 = pcVar5 + 1;
      cVar1 = pcVar5[1];
      if (cVar1 < L'b') {
        if (cVar1 < L'/') {
          if ((cVar1 != L'\"') && (cVar1 != L'\'')) {
            if (cVar1 == L'\0') {
              pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
              local_1b8._0_8_ = local_1b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"Truncated escape sequence in string literal.","");
              StaticError::StaticError(pSVar2,loc,(string *)local_1b8);
              __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
            }
switchD_00162ee0_caseD_6f:
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            local_200._M_string_length = 0;
            local_200.field_2._M_local_buf[0] = '\0';
            encode_utf8(*pcVar4,&local_200);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),"Unknown escape sequence in string literal: \'"
                       ,0x2c);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_1b8 + 0x10),local_200._M_dataplus._M_p,
                                local_200._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
            pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
            std::__cxx11::stringbuf::str();
            StaticError::StaticError(pSVar2,loc,&local_1d8);
            __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
          }
        }
        else if ((cVar1 != L'/') && (cVar1 != L'\\')) goto switchD_00162ee0_caseD_6f;
      }
      else {
        switch(cVar1) {
        case L'n':
          cVar1 = L'\n';
          break;
        case L'o':
        case L'p':
        case L'q':
        case L's':
          goto switchD_00162ee0_caseD_6f;
        case L'r':
          cVar1 = L'\r';
          break;
        case L't':
          cVar1 = L'\t';
          break;
        case L'u':
          high = jsonnet_string_parse_unicode(loc,pcVar5 + 2);
          if ((high & 0xffffffffffffe000) == 0xe000 || high < 0xd800) {
            pcVar4 = pcVar5 + 5;
          }
          else {
            if (pcVar5[6] != L'\\') {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),
                         "Invalid non-BMP Unicode escape in string literal",0x30);
              pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
              std::__cxx11::stringbuf::str();
              StaticError::StaticError(pSVar2,loc,&local_200);
              __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
            }
            if (pcVar5[7] != L'u') {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),
                         "Invalid non-BMP Unicode escape in string literal",0x30);
              pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
              std::__cxx11::stringbuf::str();
              StaticError::StaticError(pSVar2,loc,&local_200);
              __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
            }
            low = jsonnet_string_parse_unicode(loc,pcVar5 + 8);
            cVar1 = decode_utf16_surrogates(loc,high,low);
            pcVar4 = pcVar5 + 0xb;
            high = (unsigned_long)(uint)cVar1;
          }
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (__return_storage_ptr__,(char32_t)high);
          goto LAB_00162f5f;
        default:
          if (cVar1 == L'b') {
            cVar1 = L'\b';
          }
          else {
            if (cVar1 != L'f') goto switchD_00162ee0_caseD_6f;
            cVar1 = L'\f';
          }
        }
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,cVar1);
    }
    else {
      if (cVar1 == L'\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,cVar1);
      pcVar4 = pcVar5;
    }
LAB_00162f5f:
    pcVar5 = pcVar4 + 1;
  } while( true );
}

Assistant:

UString jsonnet_string_unescape(const LocationRange &loc, const UString &s)
{
    UString r;
    const char32_t *s_ptr = s.c_str();
    for (const char32_t *c = s_ptr; *c != U'\0'; ++c) {
        switch (*c) {
            case '\\':
                switch (*(++c)) {
                    case '"':
                    case '\'': r += *c; break;

                    case '\\': r += *c; break;

                    case '/': r += *c; break;

                    case 'b': r += '\b'; break;

                    case 'f': r += '\f'; break;

                    case 'n': r += '\n'; break;

                    case 'r': r += '\r'; break;

                    case 't': r += '\t'; break;

                    case 'u': {
                        ++c;  // Consume the 'u'.
                        unsigned long codepoint = jsonnet_string_parse_unicode(loc, c);

                        // Leave us on the last char, ready for the ++c at
                        // the outer for loop.
                        c += 3;
                        if (!is_bmp_codepoint(codepoint)) {
                           if (*(++c) != '\\') {
                                std::stringstream ss;
                                ss << "Invalid non-BMP Unicode escape in string literal";
                                throw StaticError(loc, ss.str());
                           }
                           if (*(++c) != 'u') {
                                std::stringstream ss;
                                ss << "Invalid non-BMP Unicode escape in string literal";
                                throw StaticError(loc, ss.str());
                           }
                           ++c;
                           unsigned long codepoint2 = jsonnet_string_parse_unicode(loc, c);
                           c += 3;
                           codepoint = decode_utf16_surrogates(loc, codepoint, codepoint2);
                       }
                       r += codepoint;
                    } break;

                    case '\0': {
                        auto msg = "Truncated escape sequence in string literal.";
                        throw StaticError(loc, msg);
                    }

                    default: {
                        std::stringstream ss;
                        std::string utf8;
                        encode_utf8(*c, utf8);
                        ss << "Unknown escape sequence in string literal: '" << utf8 << "'";
                        throw StaticError(loc, ss.str());
                    }
                }
                break;

            default:
                // Just a regular letter.
                r += *c;
        }
    }
    return r;
}